

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var4;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var5;
  pointer psVar6;
  element_type *peVar7;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar8;
  pointer ppVar9;
  pointer pbVar10;
  bool bVar11;
  bool bVar12;
  type_conflict tVar13;
  Classifier CVar14;
  int iVar15;
  iterator __begin1;
  HorribleError *pHVar16;
  long *plVar17;
  pointer puVar18;
  undefined8 *puVar19;
  App *this_00;
  pointer psVar20;
  ArgumentMismatch *pAVar21;
  int iVar22;
  long *plVar23;
  undefined7 in_register_00000011;
  Option *pOVar24;
  ulong uVar25;
  uint uVar26;
  pointer pbVar27;
  long lVar28;
  undefined8 uVar29;
  pointer ppVar30;
  App *pAVar31;
  int t;
  string nvalue;
  App *sub;
  string dummy2;
  string arg_name;
  string rest;
  string value;
  string current;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_418;
  undefined1 local_400 [36];
  uint32_t local_3dc;
  undefined1 local_3d8 [32];
  App *local_3b8;
  string local_3b0;
  pointer local_390;
  string local_388;
  undefined1 local_368 [18];
  undefined6 uStack_356;
  string local_348;
  string local_328;
  string local_308;
  undefined1 *local_2e8;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Any_data local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  anon_class_40_2_a297e68f_for__M_pred local_138;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar27 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  pcVar3 = pbVar27[-1]._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,pcVar3,pcVar3 + pbVar27[-1]._M_string_length);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  iVar15 = (int)CONCAT71(in_register_00000011,current_type);
  if (iVar15 == 2) {
    bVar12 = detail::split_short(&local_308,&local_388,&local_348);
    if (!bVar12) {
      pHVar16 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar16,&local_b0);
      __cxa_throw(pHVar16,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else if (iVar15 == 4) {
    bVar12 = detail::split_windows_style(&local_308,&local_388,&local_328);
    if (!bVar12) {
      pHVar16 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"windows option parsed but missing! You should not see this",""
                );
      HorribleError::HorribleError(pHVar16,&local_d0);
      __cxa_throw(pHVar16,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (iVar15 != 3) {
      pHVar16 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,
                 "parsing got called with invalid option! You should not see this","");
      HorribleError::HorribleError(pHVar16,&local_f0);
      __cxa_throw(pHVar16,&HorribleError::typeinfo,Error::~Error);
    }
    bVar12 = detail::split_long(&local_308,&local_388,&local_328);
    if (!bVar12) {
      pHVar16 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1));
      HorribleError::HorribleError(pHVar16,&local_50);
      __cxa_throw(pHVar16,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var4._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var5._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_138.arg_name.field_2;
  local_138.arg_name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  local_138.current_type = current_type;
  local_418 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (_Var4,_Var5,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.arg_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_138.arg_name._M_dataplus._M_p,
                    local_138.arg_name.field_2._M_allocated_capacity + 1);
  }
  if (local_418 ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar6 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar20 = (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar20 != psVar6;
        psVar20 = psVar20 + 1) {
      pAVar31 = (psVar20->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((pAVar31->name_)._M_string_length == 0) && (pAVar31->disabled_ == false)) &&
         (bVar12 = _parse_arg(pAVar31,args,current_type,param_3), bVar12)) {
        peVar7 = (psVar20->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar12 = true;
        if (peVar7->pre_parse_called_ == false) {
          pbVar27 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          peVar7->pre_parse_called_ = true;
          if ((peVar7->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
            local_400._0_8_ = (long)pbVar10 - (long)pbVar27 >> 5;
            (*(peVar7->pre_parse_callback_)._M_invoker)
                      ((_Any_data *)&peVar7->pre_parse_callback_,(unsigned_long *)local_400);
          }
        }
        goto LAB_0013bd9c;
      }
    }
    if (((current_type == SHORT) && (this->allow_non_standard_options_ != false)) &&
       (2 < local_308._M_string_length)) {
      local_400._0_8_ = local_400 + 0x10;
      local_400._8_8_ = 0;
      local_400[0x10] = '\0';
      local_3d8._8_8_ = 0;
      local_3d8._16_8_ = local_3d8._16_8_ & 0xffffffffffffff00;
      uVar25 = (ulong)unique0x100026cb >> 0x10;
      stack0xfffffffffffffca8 = (pointer)CONCAT62((int6)uVar25,0x2d);
      local_368._8_8_ = (pointer)0x1;
      local_3d8._0_8_ = (Option *)(local_3d8 + 0x10);
      local_368._0_8_ = (pointer)(local_368 + 0x10);
      plVar17 = (long *)::std::__cxx11::string::_M_append
                                  (local_368,(ulong)local_308._M_dataplus._M_p);
      plVar23 = plVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar23) {
        local_3b0.field_2._M_allocated_capacity = *plVar23;
        local_3b0.field_2._8_8_ = plVar17[3];
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      }
      else {
        local_3b0.field_2._M_allocated_capacity = *plVar23;
        local_3b0._M_dataplus._M_p = (pointer)*plVar17;
      }
      local_3b0._M_string_length = plVar17[1];
      *plVar17 = (long)plVar23;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      detail::split_long(&local_3b0,(string *)local_400,(string *)local_3d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,
                        (ulong)(local_3b0.field_2._M_allocated_capacity + 1));
      }
      if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
        operator_delete((void *)local_368._0_8_,(ulong)&stack0xfffffffffffffca8->field_0x1);
      }
      _Var4._M_current =
           (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1f8._M_unused._M_object = &local_1e8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_400._0_8_,(pointer)(local_400._0_8_ + local_400._8_8_));
      local_418 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                            (_Var4,_Var5,(anon_class_32_1_6b09f7e2_for__M_pred *)&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_unused._0_8_ != &local_1e8) {
        operator_delete(local_1f8._M_unused._M_object,local_1e8._M_allocated_capacity + 1);
      }
      puVar8 = (this->options_).
               super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_418 != puVar8) {
        ::std::__cxx11::string::_M_assign((string *)&local_388);
        ::std::__cxx11::string::_M_assign((string *)&local_328);
        local_348._M_string_length = 0;
        *local_348._M_dataplus._M_p = '\0';
      }
      if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
      }
      if ((Option *)local_400._0_8_ != (Option *)(local_400 + 0x10)) {
        operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
      }
      if (local_418 != puVar8) goto LAB_0013aae2;
    }
    if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
      uVar25 = ::std::__cxx11::string::find((char)&local_388,0x2e);
      if ((uVar25 != 0xffffffffffffffff) && (uVar25 < local_388._M_string_length - 1)) {
        ::std::__cxx11::string::substr((ulong)local_400,(ulong)&local_388);
        local_3b8 = _find_subcommand(this,(string *)local_400,true,false);
        if ((Option *)local_400._0_8_ != (Option *)(local_400 + 0x10)) {
          operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
        }
        if (local_3b8 != (App *)0x0) {
          pbVar27 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          pcVar3 = pbVar27[-1]._M_dataplus._M_p;
          local_400._0_8_ = (Option *)(local_400 + 0x10);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_400,pcVar3,pcVar3 + pbVar27[-1]._M_string_length);
          pbVar27 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar27 + -1;
          pcVar3 = pbVar27[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &pbVar27[-1].field_2) {
            operator_delete(pcVar3,pbVar27[-1].field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_388);
          ::std::__cxx11::string::operator=((string *)&local_388,(string *)local_3d8);
          if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
          }
          if (local_388._M_string_length < 2) {
            ::std::__cxx11::string::substr((ulong)local_3d8,(ulong)local_400);
            *(char *)local_3d8._0_8_ = '-';
            if (2 < (ulong)local_3d8._8_8_) {
              ::std::__cxx11::string::substr((ulong)&local_3b0,(ulong)local_3d8);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                         &local_3b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                (ulong)(local_3b0.field_2._M_allocated_capacity + 1));
              }
              ::std::__cxx11::string::resize((ulong)local_3d8,'\x02');
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,(value_type *)local_3d8);
            if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
              operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
            }
            local_3d8._8_8_ = 0;
            local_3d8._16_8_ = local_3d8._16_8_ & 0xffffffffffffff00;
            local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
            local_3b0._M_string_length = 0;
            local_3b0.field_2._M_allocated_capacity =
                 local_3b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            pbVar27 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            bVar2 = pbVar27[-1]._M_dataplus._M_p[1];
            current_type = SHORT;
            local_3d8._0_8_ = (Option *)(local_3d8 + 0x10);
            if (bVar2 == 0x2d || bVar2 < 0x22) goto LAB_0013bb12;
LAB_0013bb2d:
            bVar12 = _parse_arg(local_3b8,args,current_type,true);
            if (!bVar12) goto LAB_0013bc7f;
            if (local_3b8->silent_ == false) {
              std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                        (&this->parsed_subcommands_,&local_3b8);
            }
            increment_parsed(this);
            if (this->pre_parse_called_ == false) {
              pbVar27 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              pbVar10 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              this->pre_parse_called_ = true;
              if ((this->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0)
              {
                local_368._0_8_ = (long)pbVar27 - (long)pbVar10 >> 5;
                (*(this->pre_parse_callback_)._M_invoker)
                          ((_Any_data *)&this->pre_parse_callback_,(unsigned_long *)local_368);
              }
            }
            else if ((this->immediate_callback_ == true) && ((this->name_)._M_string_length != 0)) {
              local_3dc = this->parsed_;
              ppVar30 = (this->missing_).
                        super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_390 = (this->missing_).
                          super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              ppVar9 = (this->missing_).
                       super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_1d8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = ppVar30;
              local_1d8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = local_390;
              local_1d8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar9;
              clear(this);
              this->parsed_ = local_3dc;
              this->pre_parse_called_ = true;
              unique0x00012000 =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar9;
              local_368._0_8_ =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_368._8_8_ =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = ppVar30;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = local_390;
              local_1d8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1d8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1d8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_368);
              std::
              vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_1d8);
            }
            if ((local_3b8->parse_complete_callback_).super__Function_base._M_manager ==
                (_Manager_type)0x0) {
              bVar11 = false;
            }
            else {
              _process_env(local_3b8);
              _process_callbacks(local_3b8);
              _process_help_flags(local_3b8,false,false);
              _process_requirements(local_3b8);
              bVar11 = false;
              run_callback(local_3b8,false,true);
            }
          }
          else {
            paVar1 = &local_3b0.field_2;
            local_3b0._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"--","");
            ::std::__cxx11::string::substr((ulong)local_368,(ulong)local_400);
            uVar29 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != paVar1) {
              uVar29 = local_3b0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar29 <
                (pointer)((Classifier *)local_368._8_8_ + local_3b0._M_string_length)) {
              ppVar30 = (pointer)0xf;
              if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
                ppVar30 = stack0xfffffffffffffca8;
              }
              if (ppVar30 < (pointer)((Classifier *)local_368._8_8_ + local_3b0._M_string_length))
              goto LAB_0013ba26;
              puVar19 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)local_368,0,(char *)0x0,(ulong)local_3b0._M_dataplus._M_p)
              ;
            }
            else {
LAB_0013ba26:
              puVar19 = (undefined8 *)
                        ::std::__cxx11::string::_M_append((char *)&local_3b0,local_368._0_8_);
            }
            local_3d8._0_8_ = local_3d8 + 0x10;
            pOVar24 = (Option *)(puVar19 + 2);
            if ((Option *)*puVar19 == pOVar24) {
              local_3d8._16_8_ = (pOVar24->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
              local_3d8._24_8_ = puVar19[3];
            }
            else {
              local_3d8._16_8_ = (pOVar24->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
              local_3d8._0_8_ = (Option *)*puVar19;
            }
            local_3d8._8_8_ = puVar19[1];
            *puVar19 = pOVar24;
            puVar19[1] = 0;
            *(undefined1 *)&(pOVar24->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p = 0;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3d8);
            if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
              operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
            }
            if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,(ulong)&stack0xfffffffffffffca8->field_0x1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != paVar1) {
              operator_delete(local_3b0._M_dataplus._M_p,
                              (ulong)(local_3b0.field_2._M_allocated_capacity + 1));
            }
            local_3d8._16_8_ = local_3d8._16_8_ & 0xffffffffffffff00;
            local_3b0.field_2._M_allocated_capacity =
                 local_3b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            pbVar27 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            current_type = LONG;
LAB_0013bb12:
            local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
            local_3d8._0_8_ = local_3d8 + 0x10;
            local_3b0._M_string_length = 0;
            local_3d8._8_8_ = 0;
            bVar12 = detail::split_long((string *)(pbVar27 + -1),(string *)local_3d8,&local_3b0);
            if (bVar12) goto LAB_0013bb2d;
LAB_0013bc7f:
            pbVar27 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = pbVar27 + -1;
            pcVar3 = pbVar27[-1]._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != &pbVar27[-1].field_2) {
              operator_delete(pcVar3,pbVar27[-1].field_2._M_allocated_capacity + 1);
            }
            bVar11 = true;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,(value_type *)local_400);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
            operator_delete(local_3b0._M_dataplus._M_p,
                            (ulong)(local_3b0.field_2._M_allocated_capacity + 1));
          }
          if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
          }
          if ((Option *)local_400._0_8_ != (Option *)(local_400 + 0x10)) {
            operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
          }
          bVar12 = true;
          if (!bVar11) goto LAB_0013bd9c;
        }
      }
      if (!param_3) {
        if ((this->parent_ == (App *)0x0) || (pAVar31 = this->parent_, this->fallthrough_ != true))
        {
          pbVar27 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar27 + -1;
          pcVar3 = pbVar27[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &pbVar27[-1].field_2) {
            operator_delete(pcVar3,pbVar27[-1].field_2._M_allocated_capacity + 1);
          }
          local_400[0] = current_type;
          pAVar31 = this;
          if (this->allow_extras_ == false) {
            psVar20 = (this->subcommands_).
                      super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while ((pAVar31 = this,
                   psVar20 !=
                   (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish &&
                   ((pAVar31 = (psVar20->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr, (pAVar31->name_)._M_string_length != 0 ||
                    (pAVar31->allow_extras_ == false))))) {
              psVar20 = psVar20 + 1;
            }
          }
          ::std::
          vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
          ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                    ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                      *)&pAVar31->missing_,local_400,&local_308);
          bVar12 = true;
        }
        else {
          do {
            this_00 = pAVar31;
            if (this_00->parent_ == (App *)0x0) break;
            pAVar31 = this_00->parent_;
          } while ((this_00->name_)._M_string_length == 0);
          bVar12 = _parse_arg(this_00,args,current_type,false);
        }
        goto LAB_0013bd9c;
      }
    }
    bVar12 = false;
    goto LAB_0013bd9c;
  }
LAB_0013aae2:
  pbVar27 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pbVar27 + -1;
  pcVar3 = pbVar27[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &pbVar27[-1].field_2) {
    operator_delete(pcVar3,pbVar27[-1].field_2._M_allocated_capacity + 1);
  }
  pOVar24 = (local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (((pOVar24->inject_separator_ == true) &&
      (pbVar27 = (pOVar24->results_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
      (pOVar24->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar27)) && (pbVar27[-1]._M_string_length != 0))
  {
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    Option::_add_result(pOVar24,&local_158,&pOVar24->results_);
    pOVar24->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
  }
  pOVar24 = (local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if ((pOVar24->trigger_on_result_ == true) && (pOVar24->current_option_state_ == callback_run)) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&pOVar24->results_,
                      *(pointer *)
                       &(pOVar24->results_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl);
    pOVar24->current_option_state_ = parsing;
    pOVar24 = (local_418->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  iVar15 = pOVar24->type_size_min_;
  iVar22 = pOVar24->expected_min_ * iVar15;
  if (iVar15 <= iVar22) {
    iVar22 = iVar15;
  }
  local_390 = (pointer)CONCAT44(local_390._4_4_,iVar22);
  local_400._0_4_ = pOVar24->type_size_max_;
  tVar13 = detail::checked_multiply<int>((int *)local_400,pOVar24->expected_max_);
  local_3dc = 0x20000000;
  if (tVar13) {
    local_3dc = local_400._0_4_;
  }
  if ((int)local_3dc < 0x2000000) {
LAB_0013ac3e:
    local_3dc = local_400._0_4_;
    if (local_400._0_4_ != 0) goto LAB_0013ac4a;
    pOVar24 = (local_418->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_218._M_allocated_capacity = (size_type)&local_208;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_328._M_dataplus._M_p,
               local_328._M_dataplus._M_p + local_328._M_string_length);
    Option::get_flag_value((string *)local_400,pOVar24,&local_388,(string *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208._M_allocated_capacity + 1);
    }
    pOVar24 = (local_418->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,local_400._0_8_,(pointer)(local_400._0_8_ + local_400._8_8_));
    Option::_add_result(pOVar24,&local_238,&pOVar24->results_);
    pOVar24->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    local_3d8._0_8_ =
         (local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
         _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
               (Option **)local_3d8);
    if ((Option *)local_400._0_8_ != (Option *)(local_400 + 0x10)) {
      operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
    }
    local_3dc = 0;
LAB_0013afc3:
    iVar15 = 0;
  }
  else {
    pOVar24 = (local_418->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar24->allow_extra_args_ == false) {
      local_400._0_4_ = pOVar24->type_size_max_;
      tVar13 = detail::checked_multiply<int>((int *)local_400,pOVar24->expected_min_);
      local_3dc = 0x20000000;
      if (tVar13) {
        goto LAB_0013ac3e;
      }
    }
LAB_0013ac4a:
    if (local_328._M_string_length == 0) {
      if ((char *)local_348._M_string_length == (char *)0x0) goto LAB_0013afc3;
      pOVar24 = (local_418->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_348._M_dataplus._M_p,
                 (char *)(local_348._M_string_length + (long)local_348._M_dataplus._M_p));
      iVar15 = Option::_add_result(pOVar24,&local_278,&pOVar24->results_);
      pOVar24->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      local_400._0_8_ =
           (local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)local_400);
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_348,0,(char *)local_348._M_string_length,0x1b302c);
    }
    else {
      pOVar24 = (local_418->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_328._M_dataplus._M_p,
                 local_328._M_dataplus._M_p + local_328._M_string_length);
      iVar15 = Option::_add_result(pOVar24,&local_258,&pOVar24->results_);
      pOVar24->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      local_400._0_8_ =
           (local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)local_400);
    }
  }
  if (iVar15 < (int)local_390) {
    do {
      pbVar27 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar27) {
        pAVar21 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        Option::get_name_abi_cxx11_
                  (&local_178,
                   (local_418->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
        Option::get_type_name_abi_cxx11_
                  (&local_70,
                   (local_418->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        ArgumentMismatch::TypedAtLeast(pAVar21,&local_178,(int)local_390,&local_70);
        __cxa_throw(pAVar21,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      pcVar3 = pbVar27[-1]._M_dataplus._M_p;
      local_400._0_8_ = (Option *)(local_400 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_400,pcVar3,pcVar3 + pbVar27[-1]._M_string_length);
      pbVar27 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar27 + -1;
      pcVar3 = pbVar27[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar27[-1].field_2) {
        operator_delete(pcVar3,pbVar27[-1].field_2._M_allocated_capacity + 1);
      }
      pOVar24 = (local_418->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_400._0_8_,(pointer)(local_400._0_8_ + local_400._8_8_));
      iVar22 = Option::_add_result(pOVar24,&local_2b8,&pOVar24->results_);
      pOVar24->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      local_3d8._0_8_ =
           (local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)local_3d8);
      if ((Option *)local_400._0_8_ != (Option *)(local_400 + 0x10)) {
        operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
      }
      iVar15 = iVar15 + iVar22;
    } while (iVar15 < (int)local_390);
  }
  if ((iVar15 < (int)local_3dc) ||
     (((local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
    uVar25 = 0;
    for (puVar18 = (this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar18 !=
        (this->options_).
        super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
      pOVar24 = (puVar18->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (((((pOVar24->pname_)._M_string_length != 0) &&
           ((pOVar24->super_OptionBase<CLI::Option>).required_ == true)) &&
          (uVar26 = pOVar24->expected_min_ * pOVar24->type_size_min_, 0 < (int)uVar26)) &&
         (lVar28 = (long)(pOVar24->results_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   *(long *)&(pOVar24->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl >> 5, (int)lVar28 < (int)uVar26)) {
        uVar25 = (uVar25 + uVar26) - lVar28;
      }
    }
    local_2e8 = local_400 + 0x10;
    local_2e0 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
    do {
      if (iVar15 < (int)local_3dc) {
        pbVar27 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pbVar27 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (((local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ != true)
        goto LAB_0013b35e;
      }
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar27) goto LAB_0013b35e;
      CVar14 = _recognize(this,(string *)(pbVar27 + -1),false);
      pbVar27 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((CVar14 != NONE) ||
         ((ulong)((long)pbVar27 -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar25))
      goto LAB_0013b35e;
      if (this->validate_optional_arguments_ == true) {
        local_400._0_8_ = local_400 + 0x10;
        pcVar3 = pbVar27[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_400,pcVar3,pcVar3 + pbVar27[-1]._M_string_length);
        Option::_validate((string *)local_3d8,
                          (local_418->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                          (string *)local_400,0);
        ::std::__cxx11::string::operator=((string *)local_400,(string *)local_3d8);
        if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
          operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
        }
        uVar29 = local_400._8_8_;
        if ((Option *)local_400._0_8_ != (Option *)(local_400 + 0x10)) {
          operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
        }
        pbVar27 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (uVar29 != 0) goto LAB_0013b35e;
      }
      pOVar24 = (local_418->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_2d8._M_allocated_capacity = (size_type)&local_2c8;
      pcVar3 = pbVar27[-1]._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,pcVar3,pcVar3 + pbVar27[-1]._M_string_length);
      iVar22 = Option::_add_result(pOVar24,(string *)&local_2d8,&pOVar24->results_);
      pOVar24->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_allocated_capacity != &local_2c8) {
        operator_delete((void *)local_2d8._M_allocated_capacity,local_2c8._M_allocated_capacity + 1)
        ;
      }
      local_400._0_8_ =
           (local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                (local_2e0,(Option **)local_400);
      pbVar27 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar27 + -1;
      pcVar3 = pbVar27[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar27[-1].field_2) {
        operator_delete(pcVar3,pbVar27[-1].field_2._M_allocated_capacity + 1);
      }
      iVar15 = iVar15 + iVar22;
    } while( true );
  }
LAB_0013b4ad:
  if (0 < (int)local_390) {
    pOVar24 = (local_418->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (iVar15 % pOVar24->type_size_max_ != 0) {
      if (pOVar24->type_size_max_ == pOVar24->type_size_min_) {
        pAVar21 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        Option::get_name_abi_cxx11_
                  (&local_1b8,
                   (local_418->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
        pOVar24 = (local_418->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar15 = pOVar24->type_size_min_;
        Option::get_type_name_abi_cxx11_(&local_90,pOVar24);
        ArgumentMismatch::PartialType(pAVar21,&local_1b8,iVar15,&local_90);
        __cxa_throw(pAVar21,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      local_198._M_string_length = 0;
      local_198.field_2._M_local_buf[0] = '\0';
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      Option::_add_result(pOVar24,&local_198,&pOVar24->results_);
      pOVar24->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                 local_198.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  pOVar24 = (local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (pOVar24->trigger_on_result_ == true) {
    Option::run_callback(pOVar24);
  }
  bVar12 = true;
  if ((char *)local_348._M_string_length != (char *)0x0) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400,
                     "-",&local_348);
    ::std::__cxx11::string::operator=((string *)&local_348,(string *)local_400);
    if ((Option *)local_400._0_8_ != (Option *)(local_400 + 0x10)) {
      operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,&local_348);
  }
LAB_0013bd9c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,
                    CONCAT71(local_348.field_2._M_allocated_capacity._1_7_,
                             local_348.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,
                    CONCAT71(local_328.field_2._M_allocated_capacity._1_7_,
                             local_328.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                             local_388.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  return bVar12;
LAB_0013b35e:
  if (((args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start != pbVar27) &&
     (CVar14 = _recognize(this,(string *)(pbVar27 + -1),true), CVar14 == POSITIONAL_MARK)) {
    pbVar27 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar27 + -1;
    pcVar3 = pbVar27[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar27[-1].field_2) {
      operator_delete(pcVar3,pbVar27[-1].field_2._M_allocated_capacity + 1);
    }
  }
  if ((0 < (int)local_3dc) && (iVar15 == 0 && (int)local_390 == 0)) {
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    Option::get_flag_value
              ((string *)local_400,
               (local_418->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_388,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    pOVar24 = (local_418->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_400._0_8_,(pointer)(local_400._0_8_ + local_400._8_8_));
    Option::_add_result(pOVar24,&local_298,&pOVar24->results_);
    pOVar24->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_3d8._0_8_ =
         (local_418->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
         _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              (local_2e0,(Option **)local_3d8);
    if ((Option *)local_400._0_8_ != (Option *)(local_400 + 0x10)) {
      operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
    }
  }
  goto LAB_0013b4ad;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos && dotloc < arg_name.size() - 1) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                std::string dummy1, dummy2;
                bool val = false;
                if((current_type == detail::Classifier::SHORT && detail::valid_first_char(args.back()[1])) ||
                   detail::split_long(args.back(), dummy1, dummy2)) {
                    val = sub->_parse_arg(args, current_type, true);
                }

                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}